

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_FunImplFI2Str(int FI,int NP,Vec_Int_t *vLibFun,char *str)

{
  uint uVar1;
  uint local_88 [2];
  int N [5];
  uint local_68 [2];
  int P [5];
  int local_4c;
  int i;
  char *str_local;
  Vec_Int_t *vLibFun_local;
  int NP_local;
  int FI_local;
  
  vLibFun_local._0_4_ = NP;
  for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
    local_68[local_4c] = (uint)vLibFun_local & 7;
    local_88[local_4c] = (int)(uint)vLibFun_local >> 3 & 1;
    vLibFun_local._0_4_ = (int)(uint)vLibFun_local >> 4;
  }
  uVar1 = Vec_IntEntry(vLibFun,FI);
  sprintf(str,"[%08x(%03d),%d%d%d%d%d,%d%d%d%d%d]",(ulong)uVar1,(ulong)(uint)FI,(ulong)local_68[0],
          (ulong)local_68[1],P[0],P[1],P[2],local_88[0],local_88[1],N[0],N[1],N[2]);
  return;
}

Assistant:

void Dtt_FunImplFI2Str( int FI, int NP, Vec_Int_t* vLibFun, char* str )
{
    int i, P[5], N[5];
    for ( i = 0; i < 5; i++ )
    {
        P[i] = NP & 0x7;
        NP = NP >> 3;
        N[i] = NP & 0x1;
        NP = NP >> 1 ;
    }
    sprintf( str, "[%08x(%03d),%d%d%d%d%d,%d%d%d%d%d]", Vec_IntEntry( vLibFun, FI ), FI, P[0], P[1], P[2], P[3], P[4], N[0], N[1], N[2], N[3], N[4] ); 
}